

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chibicc_tokenize.c
# Opt level: O0

int error_sprintf(C_Parser *parser,char *fmt,...)

{
  char in_AL;
  size_t sVar1;
  char *pcVar2;
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  int local_fc;
  undefined1 local_f8 [16];
  undefined8 local_e8;
  undefined8 local_e0;
  undefined8 local_d8;
  undefined8 local_d0;
  undefined8 local_c8;
  undefined8 local_b8;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  int local_48;
  int local_44;
  int i;
  int n;
  int estimated_size;
  int pos;
  va_list args;
  char *fmt_local;
  C_Parser *parser_local;
  
  if (in_AL != '\0') {
    local_c8 = in_XMM0_Qa;
    local_b8 = in_XMM1_Qa;
    local_a8 = in_XMM2_Qa;
    local_98 = in_XMM3_Qa;
    local_88 = in_XMM4_Qa;
    local_78 = in_XMM5_Qa;
    local_68 = in_XMM6_Qa;
    local_58 = in_XMM7_Qa;
  }
  local_e8 = in_RDX;
  local_e0 = in_RCX;
  local_d8 = in_R8;
  local_d0 = in_R9;
  if (parser->error_message == (char *)0x0) {
    local_fc = 0;
  }
  else {
    sVar1 = strlen(parser->error_message);
    local_fc = (int)sVar1;
  }
  n = local_fc;
  i = 0x80;
  local_44 = 0;
  local_48 = 0;
  while( true ) {
    if (1 < local_48) {
      return local_44;
    }
    pcVar2 = (char *)(*parser->memory_allocator->realloc)
                               (parser->memory_allocator->arena,parser->error_message,(long)(n + i))
    ;
    parser->error_message = pcVar2;
    args[0].overflow_arg_area = local_f8;
    args[0]._0_8_ = &stack0x00000008;
    pos = 0x30;
    estimated_size = 0x10;
    local_44 = vsnprintf(parser->error_message + n,(long)i,fmt,&estimated_size);
    if (local_44 < i) break;
    i = local_44 + 1;
    local_48 = local_48 + 1;
  }
  if (-1 < local_44) {
    return local_44;
  }
  fprintf(_stderr,"Buffer conversion error\n");
  __assert_fail("false",
                "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/ravicomp/src/chibicc/chibicc_tokenize.c"
                ,0x2c,"int error_sprintf(C_Parser *, const char *, ...)");
}

Assistant:

static int error_sprintf(C_Parser *parser, const char *fmt, ...) {
  va_list args;
  int pos = parser->error_message ? (int)strlen(parser->error_message) : 0;
  int estimated_size = 128;
  int n = 0;
  for (int i = 0; i < 2; i++) {
    parser->error_message = parser->memory_allocator->realloc(parser->memory_allocator->arena, parser->error_message, pos + estimated_size); // ensure we have at least estimated_size free space
    va_start(args, fmt);
    n = vsnprintf(parser->error_message + pos, estimated_size, fmt, args);
    va_end(args);
    if (n >= estimated_size) {
      estimated_size = n + 1; // allow for 0 byte
    } else if (n < 0) {
      fprintf(stderr, "Buffer conversion error\n");
      assert(false);
      break;
    } else {
      break;
    }
  }
  return n;
}